

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateVPTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_4::ViewportStateBaseCase::initialize(ViewportStateBaseCase *this)

{
  Vec4 local_11c;
  Vector<float,_4> local_10c;
  PositionColorVertex local_fc;
  deUint32 local_dc;
  Vec4 local_d8;
  Vector<float,_4> local_c8;
  PositionColorVertex local_b8;
  deUint32 local_98;
  Vec4 local_94;
  Vector<float,_4> local_84;
  PositionColorVertex local_74;
  deUint32 local_54;
  Vec4 local_50;
  Vector<float,_4> local_40;
  PositionColorVertex local_30;
  ViewportStateBaseCase *local_10;
  ViewportStateBaseCase *this_local;
  
  (this->super_DynamicStateBaseClass).m_topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  local_10 = this;
  tcu::Vector<float,_4>::Vector(&local_40,-0.5,0.5,1.0,1.0);
  local_54 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_50);
  PositionColorVertex::PositionColorVertex(&local_30,&local_40,&local_50);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_30);
  tcu::Vector<float,_4>::Vector(&local_84,0.5,0.5,1.0,1.0);
  local_98 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_94);
  PositionColorVertex::PositionColorVertex(&local_74,&local_84,&local_94);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_74);
  tcu::Vector<float,_4>::Vector(&local_c8,-0.5,-0.5,1.0,1.0);
  local_dc = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_d8);
  PositionColorVertex::PositionColorVertex(&local_b8,&local_c8,&local_d8);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_b8);
  tcu::Vector<float,_4>::Vector(&local_10c,0.5,-0.5,1.0,1.0);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_11c);
  PositionColorVertex::PositionColorVertex(&local_fc,&local_10c,&local_11c);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_fc);
  DynamicStateBaseClass::initialize(&this->super_DynamicStateBaseClass);
  return;
}

Assistant:

void initialize(void)
	{
		m_topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;

		m_data.push_back(PositionColorVertex(tcu::Vec4(-0.5f, 0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(0.5f, 0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(-0.5f, -0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(0.5f, -0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		DynamicStateBaseClass::initialize();
	}